

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QFileAction.cpp
# Opt level: O0

void QFileAction::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  char16_t *pcVar1;
  code *pcVar2;
  QString *in_RCX;
  int in_EDX;
  int in_ESI;
  int *result;
  QFileAction *_t;
  
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      filePathChanged((QFileAction *)0x0,in_RCX);
    }
  }
  else if ((in_ESI == 5) &&
          (pcVar1 = (in_RCX->d).ptr, pcVar2 = *(code **)pcVar1,
          pcVar2 == filePathChanged && (pcVar2 == (code *)0x0 || *(long *)(pcVar1 + 4) == 0))) {
    (((in_RCX->d).d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i = 0;
  }
  return;
}

Assistant:

void QFileAction::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QFileAction *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->filePathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QFileAction::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QFileAction::filePathChanged)) {
                *result = 0;
                return;
            }
        }
    }
}